

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

wstring_view __thiscall mjs::lexer::get_regex_literal(lexer *this)

{
  version v;
  token_type tVar1;
  wchar_t ch;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  runtime_error *this_00;
  ulong uVar5;
  long lVar6;
  wchar_t *pwVar7;
  ulong uVar8;
  size_t sVar9;
  wstring_view wVar10;
  
  v = this->version_;
  if ((int)v < 1) {
    __assert_fail("version_ >= version::es3 && \"Regular expression literals are not support until ES3\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,600,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  tVar1 = (this->current_token_).type_;
  if ((tVar1 != divideequal) && (tVar1 != divide)) {
    __assert_fail("current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,0x259,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  sVar9 = this->text_pos_;
  uVar5 = (ulong)(tVar1 == divide) | 0xfffffffffffffffe;
  lVar6 = uVar5 + sVar9;
  if (!CARRY8(uVar5,sVar9)) {
    __assert_fail("start < text_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x25b,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  uVar5 = (this->text_)._M_len;
  pwVar7 = (this->text_)._M_str;
  bVar2 = 0;
  bVar4 = false;
  do {
    if (uVar5 <= sVar9) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Unterminated regular expression literal");
LAB_0015fd0b:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ch = pwVar7[sVar9];
    bVar3 = anon_unknown_2::is_line_terminator(ch,v);
    if (bVar3) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Line terminator in regular expression literal");
      goto LAB_0015fd0b;
    }
    if (ch == L'\\') {
      bVar4 = (bool)(bVar4 ^ 1);
    }
    else {
      if (!bVar4) {
        if (ch == L'/') {
          if (!(bool)(bVar2 & v != es3)) break;
LAB_0015fc66:
          bVar2 = 1;
        }
        else if (ch == L']') {
          bVar2 = 0;
        }
        else if (ch == L'[') goto LAB_0015fc66;
      }
      bVar4 = false;
    }
    sVar9 = sVar9 + 1;
    this->text_pos_ = sVar9;
  } while( true );
LAB_0015fc95:
  uVar8 = sVar9 + 1;
  this->text_pos_ = uVar8;
  if (uVar5 <= uVar8) {
LAB_0015fcac:
    next_token(this);
    wVar10._M_str = pwVar7 + lVar6;
    wVar10._M_len = uVar8 - lVar6;
    return wVar10;
  }
  bVar4 = anon_unknown_2::is_identifier_part(pwVar7[sVar9 + 1],this->version_);
  if (!bVar4) {
    pwVar7 = (this->text_)._M_str;
    uVar8 = this->text_pos_;
    goto LAB_0015fcac;
  }
  sVar9 = this->text_pos_;
  uVar5 = (this->text_)._M_len;
  pwVar7 = (this->text_)._M_str;
  goto LAB_0015fc95;
}

Assistant:

std::wstring_view lexer::get_regex_literal() {
    assert(version_ >= version::es3 &&  "Regular expression literals are not support until ES3");
    assert(current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal);
    const size_t start = text_pos_ - (current_token_.type() == token_type::divide ? 1 : 2);
    assert(start < text_pos_);

    // Body
    for (bool quote = false, in_class = false;; ++text_pos_) {
        if (text_pos_ >= text_.size()) {
            throw std::runtime_error("Unterminated regular expression literal");
        }
        const auto ch = text_[text_pos_];
        if (is_line_terminator(ch, version_)) {
            throw std::runtime_error("Line terminator in regular expression literal");
        } else if (ch == '\\') {
            quote = !quote;
            continue;
        } else if (quote) {
            quote = false;
            continue;
        }
        assert(!quote && ch != '\\');

        if (ch == ']') {
            in_class = false;
        } else if (ch == '[') {
            in_class = true;
        } else if (ch == '/' && (!in_class || version_ < version::es5)) {
            // forward slash can be unquoted in character classes in ES5.1
            ++text_pos_; // The final '/' is part of the regular expression
            break;
        }
    }

    // Flags
    for (; text_pos_ < text_.size(); ++text_pos_) {
        if (!is_identifier_part(text_[text_pos_], version_)) {
            break;
        }
    }

    const std::wstring_view regex_lit{&text_[start], text_pos_ - start};

    next_token();

    return regex_lit;
}